

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O3

Status __thiscall soplex::SPxBasisBase<double>::dualColStatus(SPxBasisBase<double> *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Status SVar4;
  long in_FS_OFFSET;
  
  dVar1 = (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[i];
  ::soplex::infinity::__tls_init();
  dVar2 = *(double *)(in_FS_OFFSET + -8);
  dVar3 = (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[i];
  ::soplex::infinity::__tls_init();
  if (dVar2 <= dVar1) {
    SVar4 = D_UNDEFINED;
    if (-dVar2 < dVar3) {
      SVar4 = D_ON_UPPER;
    }
  }
  else {
    SVar4 = D_ON_LOWER;
    if (-dVar2 < dVar3) {
      SVar4 = (-(uint)((this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[i] !=
                      (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[i]) & 1) * 5 + D_FREE;
    }
  }
  return SVar4;
}

Assistant:

typename SPxBasisBase<R>::Desc::Status
SPxBasisBase<R>::dualColStatus(int i) const
{
   assert(theLP != nullptr);

   if(theLP->SPxLPBase<R>::upper(i) < R(infinity))
   {
      if(theLP->SPxLPBase<R>::lower(i) > R(-infinity))
      {
         if(theLP->SPxLPBase<R>::lower(i) == theLP->SPxLPBase<R>::upper(i))
            return Desc::D_FREE;
         else
            return Desc::D_ON_BOTH;
      }
      else
         return Desc::D_ON_LOWER;
   }
   else if(theLP->SPxLPBase<R>::lower(i) > R(-infinity))
      return Desc::D_ON_UPPER;
   else
      return Desc::D_UNDEFINED;
}